

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O3

bool __thiscall
snmalloc::
RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
::find(RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
       *this,RBPath *path,K value)

{
  size_t sVar1;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *pFVar2;
  bool *pbVar4;
  bool bVar5;
  CapPtr<snmalloc::FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  CVar3;
  
  sVar1 = path->length;
  CVar3.unsafe_capptr =
       (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
        *)*(path->path)._M_elems[sVar1 - 1].node.ptr.val;
  if (CVar3.unsafe_capptr <
      (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
       *)0x2) {
    return false;
  }
  pbVar4 = &(path->path)._M_elems[sVar1].dir;
  do {
    sVar1 = sVar1 + 1;
    pFVar2 = CVar3.unsafe_capptr & 0xfffffffffffffffe;
    bVar5 = pFVar2 == value.unsafe_capptr;
    if (bVar5) {
      return bVar5;
    }
    (((RBStep *)(pbVar4 + -8))->node).ptr.val =
         (uintptr_t *)(&pFVar2->left + (pFVar2 <= value.unsafe_capptr));
    *pbVar4 = value.unsafe_capptr < pFVar2;
    path->length = sVar1;
    CVar3.unsafe_capptr = (&pFVar2->left)[pFVar2 <= value.unsafe_capptr].unsafe_capptr;
    pbVar4 = pbVar4 + 0x10;
  } while ((FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
            *)0x1 < CVar3.unsafe_capptr);
  return bVar5;
}

Assistant:

ChildRef ith(size_t n)
      {
        SNMALLOC_ASSERT(length >= n);
        return path[length - n - 1].node;
      }